

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  bool bVar1;
  byte bVar2;
  TestSpec *testSpec_00;
  pointer this;
  TestCaseInfo *prefix;
  ostream *poVar3;
  long *in_RDI;
  TestCaseInfo *testCaseInfo;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  TestSpec testSpec;
  TestSpec *in_stack_fffffffffffffe48;
  TestSpecParser *in_stack_fffffffffffffe50;
  size_t sVar4;
  TestSpecParser *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  TestSpecParser *in_stack_fffffffffffffe80;
  IConfig *in_stack_fffffffffffffe88;
  allocator *s;
  TestSpecParser *in_stack_fffffffffffffe98;
  allocator local_149;
  string local_148 [32];
  TestCaseInfo *local_128;
  TestCase *local_120;
  TestCase *local_110;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_108 [4];
  size_t local_e8;
  allocator local_d9;
  string local_d8 [208];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1b7ef2);
  if (!bVar1) {
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_fffffffffffffe50,(ITagAliasRegistry *)in_stack_fffffffffffffe48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"*",&local_d9);
    in_stack_fffffffffffffe98 =
         TestSpecParser::parse
                   (in_stack_fffffffffffffe80,
                    (string *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    TestSpecParser::testSpec(in_stack_fffffffffffffe58);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    TestSpec::~TestSpec((TestSpec *)0x1b7f90);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    TestSpecParser::~TestSpecParser(in_stack_fffffffffffffe50);
  }
  local_e8 = 0;
  testSpec_00 = (TestSpec *)getAllTestCasesSorted((IConfig *)0x1b8041);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffe98
              ,testSpec_00,in_stack_fffffffffffffe88);
  local_110 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffe48);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe50,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe48);
  local_120 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffe48);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe50,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    local_e8 = local_e8 + 1;
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(local_108);
    prefix = TestCase::getTestCaseInfo(this);
    s = &local_149;
    local_128 = prefix;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"#",s);
    bVar2 = startsWith((string *)s,&prefix->name);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    if ((bVar2 & 1) == 0) {
      poVar3 = cout();
      poVar3 = std::operator<<(poVar3,(string *)local_128);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = cout();
      poVar3 = std::operator<<(poVar3,"\"");
      poVar3 = std::operator<<(poVar3,(string *)local_128);
      in_stack_fffffffffffffe60 = std::operator<<(poVar3,"\"");
      std::ostream::operator<<(in_stack_fffffffffffffe60,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_108);
  }
  sVar4 = local_e8;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffe60)
  ;
  TestSpec::~TestSpec((TestSpec *)0x1b82a1);
  return sVar4;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            if( startsWith( testCaseInfo.name, "#" ) )
               Catch::cout() << "\"" << testCaseInfo.name << "\"" << std::endl;
            else
               Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }